

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void mzd_from_bitstream(bitstream_t *bs,mzd_local_t *v,size_t width,size_t size)

{
  uint64_t uVar1;
  word *pwVar2;
  
  pwVar2 = v->w64 + (width - 1);
  for (; 0x3f < size; size = size - 0x40) {
    uVar1 = bitstream_get_bits(bs,0x40);
    *pwVar2 = uVar1;
    pwVar2 = pwVar2 + -1;
  }
  if (size == 0) goto LAB_001097d9;
  uVar1 = bitstream_get_bits(bs,(uint)size);
  *pwVar2 = uVar1 << ((ulong)(byte)-(char)size & 0x3f);
  while( true ) {
    pwVar2 = pwVar2 + -1;
LAB_001097d9:
    if (pwVar2 < v) break;
    *pwVar2 = 0;
  }
  return;
}

Assistant:

static inline void mzd_from_bitstream(bitstream_t* bs, mzd_local_t* v, const size_t width,
                                      const size_t size) {
  uint64_t* d = &BLOCK(v, 0)->w64[width - 1];
  uint64_t* f = BLOCK(v, 0)->w64;

  size_t bits = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
    --d;
  }
  for (; d >= f; --d) {
    *d = 0;
  }
}